

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

bool boost::filesystem::detail::is_empty(path *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  stat path_stat;
  directory_iterator local_b0;
  stat64 local_a0;
  
  iVar2 = stat64((p->m_pathname)._M_dataplus._M_p,&local_a0);
  bVar1 = anon_unknown.dwarf_59d9::error((uint)(iVar2 != 0),p,ec,"boost::filesystem::is_empty");
  if (bVar1) {
    bVar1 = false;
  }
  else if ((local_a0.st_mode & 0xf000) == 0x4000) {
    directory_iterator::directory_iterator(&local_b0,p);
    bVar1 = local_b0.m_imp.px == (anonymous_namespace)::end_dir_itr;
    boost::detail::shared_count::~shared_count(&local_b0.m_imp.pn);
  }
  else {
    bVar1 = local_a0.st_size == 0;
  }
  return bVar1;
}

Assistant:

BOOST_FILESYSTEM_DECL
  bool is_empty(const path& p, system::error_code* ec)
  {
#   ifdef BOOST_POSIX_API

    struct stat path_stat;
    if (error(::stat(p.c_str(), &path_stat)!= 0,
        p, ec, "boost::filesystem::is_empty"))
      return false;        
    return S_ISDIR(path_stat.st_mode)
      ? is_empty_directory(p)
      : path_stat.st_size == 0;
#   else

    WIN32_FILE_ATTRIBUTE_DATA fad;
    if (error(::GetFileAttributesExW(p.c_str(), ::GetFileExInfoStandard, &fad)== 0
      ? BOOST_ERRNO : 0, p, ec, "boost::filesystem::is_empty"))
        return false;

    if (ec != 0) ec->clear();
    return 
      (fad.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY)
        ? is_empty_directory(p)
        : (!fad.nFileSizeHigh && !fad.nFileSizeLow);
#   endif
  }